

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopFocusScope(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->FocusScopeStack).Size;
  iVar4 = iVar1 + -1;
  (GImGui->FocusScopeStack).Size = iVar4;
  if (iVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (pIVar2->FocusScopeStack).Data[(long)iVar1 + -2];
  }
  pIVar2->CurrentFocusScopeId = uVar3;
  return;
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.FocusScopeStack.Size > 0); // Too many PopFocusScope() ?
    g.FocusScopeStack.pop_back();
    g.CurrentFocusScopeId = g.FocusScopeStack.Size ? g.FocusScopeStack.back() : 0;
}